

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Socket *this;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__return_storage_ptr__;
  undefined1 uVar1;
  ostream *poVar2;
  reference_type pbVar3;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  int __n;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int __fd;
  undefined1 local_ac [8];
  tuple<int,_sockaddr_in> result;
  Reader client_reader;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  line_read;
  Socket sk;
  
  this = (Socket *)((long)&line_read.super_type.m_storage.dummy_ + 0x18);
  rookie::Socket::Socket(this);
  __fd = 0x18aa;
  rookie::Socket::bind(this,0x18aa,__addr,in_ECX);
  rookie::Socket::listen((Socket *)((long)&line_read.super_type.m_storage.dummy_ + 0x18),__fd,__n);
  rookie::Socket::accept
            ((Socket *)local_ac,(int)&line_read + 0x20,__addr_00,
             (socklen_t *)CONCAT44(in_register_0000000c,in_ECX));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Connection established! fd is ",0x1e);
  poVar2 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      result.super__Tuple_impl<0UL,_int,_sockaddr_in>.
                      super__Tuple_impl<1UL,_sockaddr_in>.super__Head_base<1UL,_sockaddr_in,_false>.
                      _M_head_impl.sin_zero._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  client_reader._0_8_ = &client_reader.buf_._M_string_length;
  result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
  super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[4] =
       result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
       super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[0];
  result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
  super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[5] =
       result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
       super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[1];
  result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
  super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[6] =
       result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
       super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[2];
  result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
  super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[7] =
       result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
       super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero[3];
  client_reader.buf_._M_dataplus._M_p = (pointer)0x0;
  client_reader.buf_._M_string_length._0_1_ = 0;
  __return_storage_ptr__ =
       (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
       )((long)&client_reader.buf_.field_2 + 8);
  do {
    rookie::Reader::readLine_abi_cxx11_
              (__return_storage_ptr__,
               (Reader *)
               (result.super__Tuple_impl<0UL,_int,_sockaddr_in>.super__Tuple_impl<1UL,_sockaddr_in>.
                super__Head_base<1UL,_sockaddr_in,_false>._M_head_impl.sin_zero + 4));
    uVar1 = client_reader.buf_.field_2._M_local_buf[8];
    if (client_reader.buf_.field_2._M_local_buf[8] != '\0') {
      pbVar3 = boost::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(__return_storage_ptr__);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
    }
    if (((client_reader.buf_.field_2._M_local_buf[8] & 1U) != 0) &&
       ((undefined1 *)line_read.super_type._0_8_ !=
        (undefined1 *)((long)&line_read.super_type.m_storage.dummy_ + 8))) {
      operator_delete((void *)line_read.super_type._0_8_);
    }
  } while (uVar1 != '\0');
  if ((size_type *)client_reader._0_8_ != &client_reader.buf_._M_string_length) {
    operator_delete((void *)client_reader._0_8_);
  }
  if (sk.fd_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sk.fd_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]){
    boost::ignore_unused(argc);
    boost::ignore_unused(argv);

    Socket sk;
    sk.bind(6314);
    sk.listen();
    auto result = sk.accept();
    int fd = std::get<0>(result);
    std::cout << "Connection established! fd is " << fd << "." << std::endl;

    Reader client_reader(fd);

    for( ; ; ){
        boost::optional<std::string> line_read = client_reader.readLine();
        if (!line_read) break;
        std::cout << line_read.value();
    }
    return 0;
}